

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

png_uint_32 random_32(void)

{
  uint uVar1;
  png_byte mark [4];
  uint local_c;
  
  do {
    store_pool_mark((png_bytep)&local_c);
    uVar1 = local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  } while (uVar1 == 0);
  return uVar1;
}

Assistant:

static png_uint_32
random_32(void)
{

   for (;;)
   {
      png_byte mark[4];
      png_uint_32 result;

      store_pool_mark(mark);
      result = png_get_uint_32(mark);

      if (result != 0)
         return result;
   }
}